

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O1

void __thiscall calculator::ExpressionParser<__int128>::eatSpaces(ExpressionParser<__int128> *this)

{
  pointer pcVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  
  pcVar1 = (this->expr_)._M_dataplus._M_p;
  uVar2 = (this->expr_)._M_string_length;
  sVar4 = this->index_;
  while( true ) {
    iVar3 = 0;
    if (sVar4 < uVar2) {
      iVar3 = (int)pcVar1[sVar4];
    }
    iVar3 = isspace(iVar3);
    if (iVar3 == 0) break;
    sVar4 = sVar4 + 1;
    this->index_ = sVar4;
  }
  return;
}

Assistant:

void eatSpaces()
  {
    while (std::isspace(getCharacter()) != 0)
      index_++;
  }